

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O2

string * duckdb::ExtensionRepository::TryGetRepositoryUrl
                   (string *__return_storage_ptr__,string *repository)

{
  bool bVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  bVar1 = ::std::operator==(repository,"core");
  if (bVar1) {
    pcVar3 = "http://extensions.duckdb.org";
    paVar2 = &local_11;
  }
  else {
    bVar1 = ::std::operator==(repository,"core_nightly");
    if (bVar1) {
      pcVar3 = "http://nightly-extensions.duckdb.org";
      paVar2 = &local_12;
    }
    else {
      bVar1 = ::std::operator==(repository,"community");
      if (bVar1) {
        pcVar3 = "http://community-extensions.duckdb.org";
        paVar2 = &local_13;
      }
      else {
        bVar1 = ::std::operator==(repository,"local_build_debug");
        if (bVar1) {
          pcVar3 = "./build/debug/repository";
          paVar2 = &local_14;
        }
        else {
          bVar1 = ::std::operator==(repository,"local_build_release");
          if (bVar1) {
            pcVar3 = "./build/release/repository";
            paVar2 = &local_15;
          }
          else {
            pcVar3 = anon_var_dwarf_4b71df5 + 9;
            paVar2 = &local_16;
          }
        }
      }
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

string ExtensionRepository::TryGetRepositoryUrl(const string &repository) {
	if (repository == "core") {
		return CORE_REPOSITORY_URL;
	} else if (repository == "core_nightly") {
		return CORE_NIGHTLY_REPOSITORY_URL;
	} else if (repository == "community") {
		return COMMUNITY_REPOSITORY_URL;
	} else if (repository == "local_build_debug") {
		return BUILD_DEBUG_REPOSITORY_PATH;
	} else if (repository == "local_build_release") {
		return BUILD_RELEASE_REPOSITORY_PATH;
	}
	return "";
}